

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
QPDFFormFieldObjectHelper::getChoices_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  string local_c0;
  QPDFObjectHandle *local_a0;
  QPDFObjectHandle *item;
  iterator __end1;
  iterator __begin1;
  string local_80 [32];
  undefined1 local_60 [40];
  Array *local_38;
  Array *__range1;
  undefined1 local_19;
  QPDFFormFieldObjectHelper *local_18;
  QPDFFormFieldObjectHelper *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (QPDFFormFieldObjectHelper *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  bVar1 = isChoice(this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_80,"/Opt",(allocator<char> *)((long)&__begin1._M_current + 7));
    getInheritableFieldValue((QPDFFormFieldObjectHelper *)local_60,(string *)this);
    QPDFObjectHandle::as_array((Array *)(local_60 + 0x10),(QPDFObjectHandle *)local_60,any);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_60);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__begin1._M_current + 7));
    local_38 = (Array *)(local_60 + 0x10);
    __end1 = ::qpdf::Array::begin(local_38);
    item = (QPDFObjectHandle *)::qpdf::Array::end(local_38);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                       *)&item), bVar1) {
      local_a0 = __gnu_cxx::
                 __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                 ::operator*(&__end1);
      bVar1 = QPDFObjectHandle::isString(local_a0);
      if (bVar1) {
        QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_c0,local_a0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end1);
    }
    __range1._0_4_ = 2;
    ::qpdf::Array::~Array((Array *)(local_60 + 0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>
QPDFFormFieldObjectHelper::getChoices()
{
    std::vector<std::string> result;
    if (!isChoice()) {
        return result;
    }
    for (auto const& item: getInheritableFieldValue("/Opt").as_array()) {
        if (item.isString()) {
            result.emplace_back(item.getUTF8Value());
        }
    }
    return result;
}